

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void __thiscall cubeb_resampler_delay_line_Test::TestBody(cubeb_resampler_delay_line_Test *this)

{
  uint32_t channel;
  uint32_t channels;
  uint32_t chunk_size;
  uint uVar1;
  ulong uVar2;
  uint delay_frames;
  ulong uVar3;
  
  channels = 1;
  do {
    uVar3 = 4;
    do {
      uVar2 = 10;
      do {
        delay_frames = (uint)uVar3;
        fprintf(_stderr,"channel: %d, delay_frames: %d, chunk_size: %d\n",channels,uVar3,uVar2);
        test_delay_lines(delay_frames,channels,(uint32_t)uVar2);
        uVar1 = (uint32_t)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (uVar1 != 0x1f);
      uVar3 = (ulong)(delay_frames + 10);
    } while (delay_frames < 0x1f);
    channels = channels + 1;
  } while (channels != 3);
  return;
}

Assistant:

TEST(cubeb, resampler_delay_line)
{
  for (uint32_t channel = 1; channel <= 2; channel++) {
    for (uint32_t delay_frames = 4; delay_frames <= 40;
         delay_frames += chunk_increment) {
      for (uint32_t chunk_size = 10; chunk_size <= 30; chunk_size++) {
        fprintf(stderr, "channel: %d, delay_frames: %d, chunk_size: %d\n",
                channel, delay_frames, chunk_size);
        test_delay_lines(delay_frames, channel, chunk_size);
      }
    }
  }
}